

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O1

void __thiscall cmCTestCurl::cmCTestCurl(cmCTestCurl *this,cmCTest *ctest)

{
  CURL_conflict *pCVar1;
  
  this->CTest = ctest;
  cmCTestCurlOpts::cmCTestCurlOpts(&this->CurlOpts,ctest);
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Curl = (CURL *)0x0;
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HTTPProxyAuth)._M_dataplus._M_p = (pointer)&(this->HTTPProxyAuth).field_2;
  (this->HTTPProxyAuth)._M_string_length = 0;
  (this->HTTPProxyAuth).field_2._M_local_buf[0] = '\0';
  (this->HTTPProxy)._M_dataplus._M_p = (pointer)&(this->HTTPProxy).field_2;
  (this->HTTPProxy)._M_string_length = 0;
  (this->HTTPProxy).field_2._M_local_buf[0] = '\0';
  this->UseHttp10 = false;
  this->Quiet = false;
  this->TimeOutSeconds = 0;
  SetProxyType(this);
  curl_global_init(3);
  pCVar1 = curl_easy_init();
  this->Curl = pCVar1;
  return;
}

Assistant:

cmCTestCurl::cmCTestCurl(cmCTest* ctest)
  : CTest(ctest)
  , CurlOpts(ctest)
{
  this->SetProxyType();
  // In windows, this will init the winsock stuff
  ::curl_global_init(CURL_GLOBAL_ALL);
  this->Curl = curl_easy_init();
}